

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseStringToStream<16u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,
          StackStream<char> *os)

{
  byte *pbVar1;
  char *pcVar2;
  byte bVar3;
  char cVar4;
  Ch *pCVar5;
  bool bVar6;
  uint codepoint;
  uint uVar7;
  MemoryStream *pMVar8;
  char *pcVar9;
  byte *pbVar10;
  size_t escapeOffset;
  byte *pbVar11;
  long lVar12;
  
  pMVar8 = is->is_;
  pbVar11 = (byte *)pMVar8->src_;
  pbVar10 = (byte *)pMVar8->end_;
  if (pbVar11 != pbVar10) {
    do {
      bVar3 = *pbVar11;
      if (bVar3 == 0x5c) {
        escapeOffset = (long)pbVar11 - (long)pMVar8->begin_;
        pbVar1 = pbVar11 + 1;
        pMVar8->src_ = (Ch *)pbVar1;
        if (pbVar1 == pbVar10) {
LAB_0047c112:
          ParseStringToStream<16u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
                    ();
          return;
        }
        cVar4 = ""[*pbVar1];
        if (cVar4 == '\0') {
          if (*pbVar1 != 0x75) goto LAB_0047c112;
          pMVar8->src_ = (Ch *)(pbVar11 + 2);
          codepoint = ParseHex4<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                                (this,is,escapeOffset);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          if ((codepoint & 0xfffffc00) == 0xd800) {
            pMVar8 = is->is_;
            pcVar9 = pMVar8->src_;
            if ((pcVar9 == pMVar8->end_) || (*pcVar9 != '\\')) {
LAB_0047c19c:
              *(undefined4 *)(this + 0x30) = 9;
              *(size_t *)(this + 0x38) = escapeOffset;
              return;
            }
            pcVar2 = pcVar9 + 1;
            pMVar8->src_ = pcVar2;
            if ((pcVar2 == pMVar8->end_) || (*pcVar2 != 'u')) goto LAB_0047c19c;
            pMVar8->src_ = pcVar9 + 2;
            uVar7 = ParseHex4<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                              (this,is,escapeOffset);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            if (uVar7 - 0xe000 < 0xfffffc00) goto LAB_0047c19c;
            codepoint = codepoint * 0x400 + uVar7 + 0xfca02400;
          }
          UTF8<char>::
          Encode<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
                    (os,codepoint);
        }
        else {
          pMVar8->src_ = (Ch *)(pbVar11 + 2);
          pcVar9 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(os->stack_,1);
          *pcVar9 = cVar4;
          os->length_ = os->length_ + 1;
        }
      }
      else {
        if (bVar3 == 0x22) {
          pMVar8->src_ = (Ch *)(pbVar11 + 1);
          pcVar9 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(os->stack_,1);
          *pcVar9 = '\0';
          os->length_ = os->length_ + 1;
          return;
        }
        if (bVar3 < 0x20) {
          if (bVar3 != 0) {
            if (*(int *)(this + 0x30) != 0) {
              __assert_fail("!HasParseError()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/reader.h"
                            ,0x37f,
                            "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseStringToStream(InputStream &, OutputStream &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 16U, SEncoding = rapidjson::UTF8<>, TEncoding = rapidjson::UTF8<>, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, OutputStream = rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::StackStream<char>]"
                           );
            }
            lVar12 = (long)pbVar11 - (long)pMVar8->begin_;
            *(undefined4 *)(this + 0x30) = 10;
            goto LAB_0047c16a;
          }
          break;
        }
        pCVar5 = pMVar8->begin_;
        bVar6 = Transcoder<rapidjson::UTF8<char>,rapidjson::UTF8<char>>::
                Transcode<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
                          (is,os);
        if (!bVar6) {
          if (*(int *)(this + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/reader.h"
                          ,0x386,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseStringToStream(InputStream &, OutputStream &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 16U, SEncoding = rapidjson::UTF8<>, TEncoding = rapidjson::UTF8<>, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, OutputStream = rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::StackStream<char>]"
                         );
          }
          lVar12 = (long)pbVar11 - (long)pCVar5;
          *(undefined4 *)(this + 0x30) = 0xc;
          goto LAB_0047c16a;
        }
      }
      pMVar8 = is->is_;
      pbVar11 = (byte *)pMVar8->src_;
      pbVar10 = (byte *)pMVar8->end_;
    } while (pbVar11 != pbVar10);
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/reader.h"
                  ,0x37d,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseStringToStream(InputStream &, OutputStream &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 16U, SEncoding = rapidjson::UTF8<>, TEncoding = rapidjson::UTF8<>, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, OutputStream = rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::StackStream<char>]"
                 );
  }
  lVar12 = (long)pbVar11 - (long)pMVar8->begin_;
  *(undefined4 *)(this + 0x30) = 0xb;
LAB_0047c16a:
  *(long *)(this + 0x38) = lVar12;
  return;
}

Assistant:

RAPIDJSON_FORCEINLINE void ParseStringToStream(InputStream& is, OutputStream& os) {
//!@cond RAPIDJSON_HIDDEN_FROM_DOXYGEN
#define Z16 0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0
        static const char escape[256] = {
            Z16, Z16, 0, 0,'\"', 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,'/',
            Z16, Z16, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,'\\', 0, 0, 0,
            0, 0,'\b', 0, 0, 0,'\f', 0, 0, 0, 0, 0, 0, 0,'\n', 0,
            0, 0,'\r', 0,'\t', 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
            Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16
        };
#undef Z16
//!@endcond

        for (;;) {
            // Scan and copy string before "\\\"" or < 0x20. This is an optional optimzation.
            if (!(parseFlags & kParseValidateEncodingFlag))
                ScanCopyUnescapedString(is, os);

            Ch c = is.Peek();
            if (RAPIDJSON_UNLIKELY(c == '\\')) {    // Escape
                size_t escapeOffset = is.Tell();    // For invalid escaping, report the inital '\\' as error offset
                is.Take();
                Ch e = is.Peek();
                if ((sizeof(Ch) == 1 || unsigned(e) < 256) && RAPIDJSON_LIKELY(escape[static_cast<unsigned char>(e)])) {
                    is.Take();
                    os.Put(static_cast<typename TEncoding::Ch>(escape[static_cast<unsigned char>(e)]));
                }
                else if (RAPIDJSON_LIKELY(e == 'u')) {    // Unicode
                    is.Take();
                    unsigned codepoint = ParseHex4(is, escapeOffset);
                    RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                    if (RAPIDJSON_UNLIKELY(codepoint >= 0xD800 && codepoint <= 0xDBFF)) {
                        // Handle UTF-16 surrogate pair
                        if (RAPIDJSON_UNLIKELY(!Consume(is, '\\') || !Consume(is, 'u')))
                            RAPIDJSON_PARSE_ERROR(kParseErrorStringUnicodeSurrogateInvalid, escapeOffset);
                        unsigned codepoint2 = ParseHex4(is, escapeOffset);
                        RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                        if (RAPIDJSON_UNLIKELY(codepoint2 < 0xDC00 || codepoint2 > 0xDFFF))
                            RAPIDJSON_PARSE_ERROR(kParseErrorStringUnicodeSurrogateInvalid, escapeOffset);
                        codepoint = (((codepoint - 0xD800) << 10) | (codepoint2 - 0xDC00)) + 0x10000;
                    }
                    TEncoding::Encode(os, codepoint);
                }
                else
                    RAPIDJSON_PARSE_ERROR(kParseErrorStringEscapeInvalid, escapeOffset);
            }
            else if (RAPIDJSON_UNLIKELY(c == '"')) {    // Closing double quote
                is.Take();
                os.Put('\0');   // null-terminate the string
                return;
            }
            else if (RAPIDJSON_UNLIKELY(static_cast<unsigned>(c) < 0x20)) { // RFC 4627: unescaped = %x20-21 / %x23-5B / %x5D-10FFFF
                if (c == '\0')
                    RAPIDJSON_PARSE_ERROR(kParseErrorStringMissQuotationMark, is.Tell());
                else
                    RAPIDJSON_PARSE_ERROR(kParseErrorStringEscapeInvalid, is.Tell());
            }
            else {
                size_t offset = is.Tell();
                if (RAPIDJSON_UNLIKELY((parseFlags & kParseValidateEncodingFlag ?
                    !Transcoder<SEncoding, TEncoding>::Validate(is, os) :
                    !Transcoder<SEncoding, TEncoding>::Transcode(is, os))))
                    RAPIDJSON_PARSE_ERROR(kParseErrorStringInvalidEncoding, offset);
            }
        }
    }